

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O0

Display * __thiscall tcu::x11::VulkanPlatform::createWsiDisplay(VulkanPlatform *this,Type wsiType)

{
  VulkanDisplayXlib *this_00;
  XlibDisplay *this_01;
  VulkanDisplayXcb *this_02;
  XcbDisplay *this_03;
  NotSupportedError *this_04;
  DefaultDeleter<tcu::x11::DisplayBase> local_51;
  MovePtr<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_> local_50;
  undefined1 local_3e;
  DefaultDeleter<tcu::x11::DisplayBase> local_3d [13];
  MovePtr<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_> local_30;
  Type local_1c;
  VulkanPlatform *pVStack_18;
  Type wsiType_local;
  VulkanPlatform *this_local;
  
  local_1c = wsiType;
  pVStack_18 = this;
  if (wsiType == TYPE_XLIB) {
    this_00 = (VulkanDisplayXlib *)operator_new(0x20);
    local_3e = 1;
    this_01 = (XlibDisplay *)operator_new(0x20);
    XlibDisplay::XlibDisplay(this_01,this->m_eventState,"");
    de::DefaultDeleter<tcu::x11::DisplayBase>::DefaultDeleter(local_3d);
    de::details::MovePtr<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_>::MovePtr
              (&local_30,this_01);
    VulkanDisplayXlib::VulkanDisplayXlib(this_00,&local_30);
    local_3e = 0;
    this_local = (VulkanPlatform *)this_00;
    de::details::MovePtr<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_>::
    ~MovePtr(&local_30);
  }
  else {
    if (wsiType != TYPE_XCB) {
      this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      NotSupportedError::NotSupportedError
                (this_04,"WSI type not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11VulkanPlatform.cpp"
                 ,0xa5);
      __cxa_throw(this_04,&NotSupportedError::typeinfo,NotSupportedError::~NotSupportedError);
    }
    this_02 = (VulkanDisplayXcb *)operator_new(0x20);
    this_03 = (XcbDisplay *)operator_new(0x20);
    XcbDisplay::XcbDisplay(this_03,this->m_eventState,"");
    de::DefaultDeleter<tcu::x11::DisplayBase>::DefaultDeleter(&local_51);
    de::details::MovePtr<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_>::MovePtr
              (&local_50,this_03);
    VulkanDisplayXcb::VulkanDisplayXcb(this_02,&local_50);
    this_local = (VulkanPlatform *)this_02;
    de::details::MovePtr<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_>::
    ~MovePtr(&local_50);
  }
  return (Display *)this_local;
}

Assistant:

vk::wsi::Display* VulkanPlatform::createWsiDisplay (vk::wsi::Type wsiType) const
{
	switch(wsiType)
	{
	case vk::wsi::TYPE_XLIB:
		return new VulkanDisplayXlib(MovePtr<DisplayBase>(new XlibDisplay(m_eventState,"")));
		break;
#if defined (DEQP_SUPPORT_XCB)
	case vk::wsi::TYPE_XCB:
		return new VulkanDisplayXcb(MovePtr<DisplayBase>(new XcbDisplay(m_eventState,"")));
		break;
#endif // DEQP_SUPPORT_XCB
	default:
		TCU_THROW(NotSupportedError, "WSI type not supported");

	};
}